

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O3

string * __thiscall
LongReadsDatastore::ls_abi_cxx11_
          (string *__return_storage_ptr__,LongReadsDatastore *this,int level,bool recursive)

{
  ostream *poVar1;
  string spacer;
  stringstream ss;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)level * '\x02');
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1f8,local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Long Reads Datastore ",0x15);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," reads",6);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (recursive) {
    LongReadsMapper::ls_abi_cxx11_(&local_1d8,&this->mapper,level + 1,true);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string LongReadsDatastore::ls(int level, bool recursive) const {
    std::stringstream ss;
    std::string spacer(2*level,' ');
    ss<<spacer<<"Long Reads Datastore "<<name<<": "<<size()<<" reads"<<std::endl;
    if (recursive) ss<<mapper.ls(level+1,true);
    return ss.str();
}